

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::startsWith(string *s,string *prefix)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  uVar1 = s->_M_string_length;
  uVar2 = prefix->_M_string_length;
  if (uVar1 < uVar2) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    std::__cxx11::string::substr((ulong)&local_48,(ulong)s);
    if (local_40 == prefix->_M_string_length) {
      if (local_40 == 0) {
        bVar4 = true;
      }
      else {
        iVar3 = bcmp(local_48,(prefix->_M_dataplus)._M_p,local_40);
        bVar4 = iVar3 == 0;
      }
    }
  }
  if ((uVar2 <= uVar1) && (local_48 != local_38)) {
    operator_delete(local_48);
  }
  return bVar4;
}

Assistant:

bool startsWith( std::string const& s, std::string const& prefix ) {
        return s.size() >= prefix.size() && s.substr( 0, prefix.size() ) == prefix;
    }